

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O1

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::remaxCol(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,int p_col,int len)

{
  Dring *pDVar1;
  int iVar2;
  undefined8 uVar3;
  Dring *pDVar4;
  Dring *pDVar5;
  int *piVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  int *piVar10;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<50U,_int,_void> vv;
  cpp_dec_float<50U,_int,_void> local_d8;
  cpp_dec_float<50U,_int,_void> local_a0;
  cpp_dec_float<50U,_int,_void> local_68;
  
  if ((Col *)(this->u).col.elem[p_col].next == &(this->u).col) {
    iVar7 = len - (this->u).col.max[p_col];
    if ((this->u).col.size - (this->u).col.used < iVar7) {
      packColumns(this);
      iVar7 = len - (this->u).col.max[p_col];
      local_d8.fpclass = cpp_dec_float_finite;
      local_d8.prec_elem = 10;
      local_d8.data._M_elems[0] = 0;
      local_d8.data._M_elems[1] = 0;
      local_d8.data._M_elems[2] = 0;
      local_d8.data._M_elems[3] = 0;
      local_d8.data._M_elems[4] = 0;
      local_d8.data._M_elems[5] = 0;
      local_d8.data._M_elems._24_5_ = 0;
      local_d8.data._M_elems[7]._1_3_ = 0;
      local_d8.data._M_elems._32_5_ = 0;
      local_d8.data._M_elems[9]._1_3_ = 0;
      local_d8.exp = 0;
      local_d8.neg = false;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                (&local_a0,(long)(this->u).col.used,(type *)0x0);
      if (&local_d8 != &(this->colMemMult).m_backend) {
        uVar3 = *(undefined8 *)((this->colMemMult).m_backend.data._M_elems + 8);
        local_d8.data._M_elems._32_5_ = SUB85(uVar3,0);
        local_d8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
        local_d8.data._M_elems._0_8_ = *(undefined8 *)(this->colMemMult).m_backend.data._M_elems;
        local_d8.data._M_elems._8_8_ =
             *(undefined8 *)((this->colMemMult).m_backend.data._M_elems + 2);
        local_d8.data._M_elems._16_8_ =
             *(undefined8 *)((this->colMemMult).m_backend.data._M_elems + 4);
        uVar3 = *(undefined8 *)((this->colMemMult).m_backend.data._M_elems + 6);
        local_d8.data._M_elems._24_5_ = SUB85(uVar3,0);
        local_d8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
        local_d8.exp = (this->colMemMult).m_backend.exp;
        local_d8.neg = (this->colMemMult).m_backend.neg;
        local_d8.fpclass = (this->colMemMult).m_backend.fpclass;
        local_d8.prec_elem = (this->colMemMult).m_backend.prec_elem;
      }
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                (&local_d8,&local_a0);
      local_68.fpclass = cpp_dec_float_finite;
      local_68.prec_elem = 10;
      local_68.data._M_elems[0] = 0;
      local_68.data._M_elems[1] = 0;
      local_68.data._M_elems[2] = 0;
      local_68.data._M_elems[3] = 0;
      local_68.data._M_elems[4] = 0;
      local_68.data._M_elems[5] = 0;
      local_68.data._M_elems._24_5_ = 0;
      local_68.data._M_elems[7]._1_3_ = 0;
      local_68.data._M_elems._32_5_ = 0;
      local_68.data._M_elems[9]._1_3_ = 0;
      local_68.exp = 0;
      local_68.neg = false;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                (&local_a0,(long)len,(type *)0x0);
      local_68.data._M_elems._32_5_ = local_d8.data._M_elems._32_5_;
      local_68.data._M_elems[9]._1_3_ = local_d8.data._M_elems[9]._1_3_;
      local_68.data._M_elems[4] = local_d8.data._M_elems[4];
      local_68.data._M_elems[5] = local_d8.data._M_elems[5];
      local_68.data._M_elems._24_5_ = local_d8.data._M_elems._24_5_;
      local_68.data._M_elems[7]._1_3_ = local_d8.data._M_elems[7]._1_3_;
      local_68.data._M_elems[0] = local_d8.data._M_elems[0];
      local_68.data._M_elems[1] = local_d8.data._M_elems[1];
      local_68.data._M_elems[2] = local_d8.data._M_elems[2];
      local_68.data._M_elems[3] = local_d8.data._M_elems[3];
      local_68.exp = local_d8.exp;
      local_68.neg = local_d8.neg;
      local_68.fpclass = local_d8.fpclass;
      local_68.prec_elem = local_d8.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                (&local_68,&local_a0);
      if (local_68.fpclass != cpp_dec_float_NaN) {
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                  (&local_a0,(long)(this->u).col.size,(type *)0x0);
        iVar8 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                          (&local_68,&local_a0);
        if ((0 < iVar8) && (iVar8 = len + (this->u).col.used * 2, (this->u).col.size < iVar8)) {
          (this->u).col.size = iVar8;
          spx_realloc<int*>(&(this->u).col.idx,iVar8);
        }
      }
    }
    piVar10 = &(this->u).col.used;
    *piVar10 = *piVar10 + iVar7;
    (this->u).col.max[p_col] = len;
  }
  else {
    if ((this->u).col.size - (this->u).col.used < len) {
      packColumns(this);
      local_d8.fpclass = cpp_dec_float_finite;
      local_d8.prec_elem = 10;
      local_d8.data._M_elems[0] = 0;
      local_d8.data._M_elems[1] = 0;
      local_d8.data._M_elems[2] = 0;
      local_d8.data._M_elems[3] = 0;
      local_d8.data._M_elems[4] = 0;
      local_d8.data._M_elems[5] = 0;
      local_d8.data._M_elems._24_5_ = 0;
      local_d8.data._M_elems[7]._1_3_ = 0;
      local_d8.data._M_elems._32_5_ = 0;
      local_d8.data._M_elems[9]._1_3_ = 0;
      local_d8.exp = 0;
      local_d8.neg = false;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                (&local_a0,(long)(this->u).col.used,(type *)0x0);
      if (&local_d8 != &(this->colMemMult).m_backend) {
        uVar3 = *(undefined8 *)((this->colMemMult).m_backend.data._M_elems + 8);
        local_d8.data._M_elems._32_5_ = SUB85(uVar3,0);
        local_d8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
        local_d8.data._M_elems._0_8_ = *(undefined8 *)(this->colMemMult).m_backend.data._M_elems;
        local_d8.data._M_elems._8_8_ =
             *(undefined8 *)((this->colMemMult).m_backend.data._M_elems + 2);
        local_d8.data._M_elems._16_8_ =
             *(undefined8 *)((this->colMemMult).m_backend.data._M_elems + 4);
        uVar3 = *(undefined8 *)((this->colMemMult).m_backend.data._M_elems + 6);
        local_d8.data._M_elems._24_5_ = SUB85(uVar3,0);
        local_d8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
        local_d8.exp = (this->colMemMult).m_backend.exp;
        local_d8.neg = (this->colMemMult).m_backend.neg;
        local_d8.fpclass = (this->colMemMult).m_backend.fpclass;
        local_d8.prec_elem = (this->colMemMult).m_backend.prec_elem;
      }
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                (&local_d8,&local_a0);
      local_68.fpclass = cpp_dec_float_finite;
      local_68.prec_elem = 10;
      local_68.data._M_elems[0] = 0;
      local_68.data._M_elems[1] = 0;
      local_68.data._M_elems[2] = 0;
      local_68.data._M_elems[3] = 0;
      local_68.data._M_elems[4] = 0;
      local_68.data._M_elems[5] = 0;
      local_68.data._M_elems._24_5_ = 0;
      local_68.data._M_elems[7]._1_3_ = 0;
      local_68.data._M_elems._32_5_ = 0;
      local_68.data._M_elems[9]._1_3_ = 0;
      local_68.exp = 0;
      local_68.neg = false;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                (&local_a0,(long)len,(type *)0x0);
      local_68.data._M_elems._32_5_ = local_d8.data._M_elems._32_5_;
      local_68.data._M_elems[9]._1_3_ = local_d8.data._M_elems[9]._1_3_;
      local_68.data._M_elems[4] = local_d8.data._M_elems[4];
      local_68.data._M_elems[5] = local_d8.data._M_elems[5];
      local_68.data._M_elems._24_5_ = local_d8.data._M_elems._24_5_;
      local_68.data._M_elems[7]._1_3_ = local_d8.data._M_elems[7]._1_3_;
      local_68.data._M_elems[0] = local_d8.data._M_elems[0];
      local_68.data._M_elems[1] = local_d8.data._M_elems[1];
      local_68.data._M_elems[2] = local_d8.data._M_elems[2];
      local_68.data._M_elems[3] = local_d8.data._M_elems[3];
      local_68.exp = local_d8.exp;
      local_68.neg = local_d8.neg;
      local_68.fpclass = local_d8.fpclass;
      local_68.prec_elem = local_d8.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                (&local_68,&local_a0);
      if (local_68.fpclass != cpp_dec_float_NaN) {
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                  (&local_a0,(long)(this->u).col.size,(type *)0x0);
        iVar7 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                          (&local_68,&local_a0);
        if ((0 < iVar7) && (iVar7 = len + (this->u).col.used * 2, (this->u).col.size < iVar7)) {
          (this->u).col.size = iVar7;
          spx_realloc<int*>(&(this->u).col.idx,iVar7);
        }
      }
    }
    iVar7 = (this->u).col.used;
    piVar10 = (this->u).col.start;
    iVar8 = piVar10[p_col];
    lVar9 = (long)iVar8;
    iVar2 = (this->u).col.len[p_col];
    piVar10[p_col] = iVar7;
    piVar10 = &(this->u).col.used;
    *piVar10 = *piVar10 + len;
    piVar10 = (this->u).col.max;
    pDVar1 = (this->u).col.elem + p_col;
    piVar10[pDVar1->prev->idx] = piVar10[pDVar1->prev->idx] + piVar10[p_col];
    piVar10[p_col] = len;
    pDVar4 = pDVar1->next;
    pDVar4->prev = pDVar1->prev;
    pDVar1->prev->next = pDVar4;
    pDVar4 = (this->u).col.list.prev;
    pDVar5 = pDVar4->next;
    pDVar1->next = pDVar5;
    pDVar5->prev = pDVar1;
    pDVar1->prev = pDVar4;
    pDVar4->next = pDVar1;
    if (0 < iVar2) {
      piVar6 = (this->u).col.idx;
      piVar10 = piVar6 + iVar7;
      do {
        *piVar10 = piVar6[lVar9];
        lVar9 = lVar9 + 1;
        piVar10 = piVar10 + 1;
      } while (lVar9 < iVar2 + iVar8);
    }
  }
  return;
}

Assistant:

void CLUFactor<R>::remaxCol(int p_col, int len)
{
   assert(u.col.max[p_col] < len);

   if(u.col.elem[p_col].next == &(u.col.list))      /* last in column file */
   {
      int delta = len - u.col.max[p_col];

      if(delta > u.col.size - u.col.used)
      {
         packColumns();
         delta = len - u.col.max[p_col];

         if(u.col.size < colMemMult * u.col.used + len)
            minColMem(2 * u.col.used + len);

         /* minColMem(colMemMult * u.col.used + len); */
      }

      assert(delta <= u.col.size - u.col.used

             && "ERROR: could not allocate memory for column file");

      u.col.used += delta;
      u.col.max[p_col] = len;
   }

   else                        /* column must be moved to end of column file */
   {
      int i, j, k;
      int* idx;
      Dring* ring;

      if(len > u.col.size - u.col.used)
      {
         packColumns();

         if(u.col.size < colMemMult * u.col.used + len)
            minColMem(2 * u.col.used + len);

         /* minColMem(colMemMult * u.col.used + len); */
      }

      assert(len <= u.col.size - u.col.used

             && "ERROR: could not allocate memory for column file");

      j = u.col.used;
      i = u.col.start[p_col];
      k = u.col.len[p_col] + i;
      u.col.start[p_col] = j;
      u.col.used += len;

      u.col.max[u.col.elem[p_col].prev->idx] += u.col.max[p_col];
      u.col.max[p_col] = len;
      removeDR(u.col.elem[p_col]);
      ring = u.col.list.prev;
      init2DR(u.col.elem[p_col], *ring);

      idx = u.col.idx;

      for(; i < k; ++i)
         idx[j++] = idx[i];
   }
}